

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrix.h
# Opt level: O3

void __thiscall ZXing::BitMatrix::BitMatrix(BitMatrix *this,int width,int height)

{
  invalid_argument *this_00;
  allocator_type local_29;
  
  this->_width = width;
  this->_height = height;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->_bits,(long)(height * width),"",&local_29);
  if ((width != 0) &&
     ((*(int *)&(this->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish -
      *(int *)&(this->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start) / width != height)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Invalid size: width * height is too big");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

BitMatrix(int width, int height) : _width(width), _height(height), _bits(width * height, UNSET_V)
	{
		if (width != 0 && Size(_bits) / width != height)
			throw std::invalid_argument("Invalid size: width * height is too big");
	}